

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Action.cpp
# Opt level: O2

int __thiscall
PrintTableStatus::clone
          (PrintTableStatus *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  PrintTableStatus *this_00;
  
  this_00 = (PrintTableStatus *)operator_new(0x30);
  PrintTableStatus(this_00,this);
  return (int)this_00;
}

Assistant:

BaseAction *PrintTableStatus::clone() {
    return (new PrintTableStatus(*this));
}